

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterLoadDlidx(Fts5Index *p,Fts5SegIter *pIter)

{
  Fts5DlidxIter *pFVar1;
  Fts5Data *pLeaf;
  int bRev;
  int iSeg;
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  if ((pIter->iTermLeafPgno != pIter->iLeafPgno) || (pIter->pLeaf->szLeaf <= pIter->iEndofDoclist))
  {
    pFVar1 = fts5DlidxIterInit(p,pIter->flags & 2,pIter->pSeg->iSegid,pIter->iTermLeafPgno);
    pIter->pDlidx = pFVar1;
  }
  return;
}

Assistant:

static void fts5SegIterLoadDlidx(Fts5Index *p, Fts5SegIter *pIter){
  int iSeg = pIter->pSeg->iSegid;
  int bRev = (pIter->flags & FTS5_SEGITER_REVERSE);
  Fts5Data *pLeaf = pIter->pLeaf; /* Current leaf data */

  assert( pIter->flags & FTS5_SEGITER_ONETERM );
  assert( pIter->pDlidx==0 );

  /* Check if the current doclist ends on this page. If it does, return
  ** early without loading the doclist-index (as it belongs to a different
  ** term. */
  if( pIter->iTermLeafPgno==pIter->iLeafPgno 
   && pIter->iEndofDoclist<pLeaf->szLeaf 
  ){
    return;
  }

  pIter->pDlidx = fts5DlidxIterInit(p, bRev, iSeg, pIter->iTermLeafPgno);
}